

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_png.cpp
# Opt level: O0

uint M_NextPNGChunk(PNGHandle *png,DWORD id)

{
  uint uVar1;
  FileReader *pFVar2;
  uint uVar3;
  Chunk *pCVar4;
  DWORD id_local;
  PNGHandle *png_local;
  
  while( true ) {
    uVar1 = png->ChunkPt;
    uVar3 = TArray<PNGHandle::Chunk,_PNGHandle::Chunk>::Size(&png->Chunks);
    if (uVar3 <= uVar1) {
      return 0;
    }
    pCVar4 = TArray<PNGHandle::Chunk,_PNGHandle::Chunk>::operator[]
                       (&png->Chunks,(ulong)png->ChunkPt);
    if (pCVar4->ID == id) break;
    png->ChunkPt = png->ChunkPt + 1;
  }
  pFVar2 = png->File;
  uVar1 = png->ChunkPt;
  png->ChunkPt = uVar1 + 1;
  pCVar4 = TArray<PNGHandle::Chunk,_PNGHandle::Chunk>::operator[](&png->Chunks,(ulong)uVar1);
  (*(pFVar2->super_FileReaderBase)._vptr_FileReaderBase[4])(pFVar2,(ulong)pCVar4->Offset,0);
  pCVar4 = TArray<PNGHandle::Chunk,_PNGHandle::Chunk>::operator[]
                     (&png->Chunks,(ulong)(png->ChunkPt - 1));
  return pCVar4->Size;
}

Assistant:

unsigned int M_NextPNGChunk (PNGHandle *png, DWORD id)
{
	for ( ; png->ChunkPt < png->Chunks.Size(); ++png->ChunkPt)
	{
		if (png->Chunks[png->ChunkPt].ID == id)
		{ // Found the chunk
			png->File->Seek (png->Chunks[png->ChunkPt++].Offset, SEEK_SET);
			return png->Chunks[png->ChunkPt - 1].Size;
		}
	}
	return 0;
}